

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O1

void kf_work(kiss_fft_cpx *Fout,kiss_fft_cpx *f,size_t fstride,int in_stride,int *factors,
            kiss_fft_cfg st)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  kiss_fft_cpx *pkVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  kiss_fft_cpx *pkVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  float fVar15;
  float fVar20;
  kiss_fft_cpx kVar16;
  kiss_fft_cpx kVar17;
  kiss_fft_cpx kVar18;
  kiss_fft_cpx kVar19;
  float fVar21;
  kiss_fft_cpx kVar22;
  kiss_fft_cpx kVar23;
  float fVar25;
  kiss_fft_cpx kVar24;
  kiss_fft_cpx kVar26;
  kiss_fft_cpx kVar27;
  kiss_fft_cpx kVar28;
  float fVar29;
  float fVar31;
  kiss_fft_cpx kVar30;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  long local_68;
  kiss_fft_cpx *local_60;
  int local_58;
  
  uVar3 = *factors;
  iVar11 = factors[1];
  lVar6 = (long)iVar11;
  if (lVar6 == 1) {
    lVar7 = 0;
    do {
      *(kiss_fft_cpx *)((long)&Fout->r + lVar7) = *f;
      f = f + (long)in_stride * fstride;
      lVar7 = lVar7 + 8;
    } while ((long)(int)(iVar11 * uVar3) * 8 != lVar7);
  }
  else {
    lVar7 = 0;
    do {
      kf_work((kiss_fft_cpx *)((long)&Fout->r + lVar7),f,(long)(int)uVar3 * fstride,in_stride,
              factors + 2,st);
      f = f + (long)in_stride * fstride;
      lVar7 = lVar7 + lVar6 * 8;
    } while ((long)(int)(iVar11 * uVar3) * 8 != lVar7);
  }
  switch(uVar3) {
  case 2:
    pkVar5 = st->twiddles;
    lVar7 = 0;
    do {
      fVar20 = (*pkVar5).r;
      fVar21 = (*pkVar5).i;
      fVar15 = Fout[lVar6 + lVar7].r * fVar20 + fVar21 * -Fout[lVar6 + lVar7].i;
      fVar20 = Fout[lVar6 + lVar7].r * fVar21 + fVar20 * Fout[lVar6 + lVar7].i;
      kVar22.r = Fout[lVar7].r - fVar15;
      kVar22.i = Fout[lVar7].i - fVar20;
      Fout[lVar6 + lVar7] = kVar22;
      kVar23.r = Fout[lVar7].r + fVar15;
      kVar23.i = Fout[lVar7].i + fVar20;
      Fout[lVar7] = kVar23;
      lVar7 = lVar7 + 1;
      pkVar5 = pkVar5 + fstride;
    } while (iVar11 != (int)lVar7);
    break;
  case 3:
    fVar15 = st->twiddles[lVar6 * fstride].i;
    lVar10 = 0;
    lVar7 = lVar6;
    do {
      uVar1 = *(undefined8 *)((long)&st->twiddles[0].r + lVar10);
      fVar20 = (float)uVar1;
      fVar21 = (float)((ulong)uVar1 >> 0x20);
      fVar25 = Fout[lVar6].r * fVar21 + Fout[lVar6].i * fVar20;
      fVar40 = Fout[lVar6].r * fVar20 + -Fout[lVar6].i * fVar21;
      uVar1 = *(undefined8 *)((long)&st->twiddles[0].r + lVar10 * 2);
      fVar21 = (float)uVar1;
      fVar35 = (float)((ulong)uVar1 >> 0x20);
      fVar20 = Fout[lVar6 * 2].r * fVar35 + Fout[lVar6 * 2].i * fVar21;
      fVar21 = Fout[lVar6 * 2].r * fVar21 + -Fout[lVar6 * 2].i * fVar35;
      fVar35 = (fVar25 - fVar20) * fVar15;
      fVar33 = (fVar40 - fVar21) * fVar15;
      fVar20 = fVar20 + fVar25;
      fVar21 = fVar21 + fVar40;
      kVar27.i = fVar20 * -0.5 + (*Fout).i;
      kVar27.r = fVar21 * -0.5 + (*Fout).r;
      Fout[lVar6] = kVar27;
      kVar28.r = (*Fout).r + fVar21;
      kVar28.i = (*Fout).i + fVar20;
      *Fout = kVar28;
      kVar26.i = Fout[lVar6].i - fVar33;
      kVar26.r = Fout[lVar6].r + fVar35;
      Fout[lVar6 * 2] = kVar26;
      kVar30.i = fVar33 + Fout[lVar6].i;
      kVar30.r = Fout[lVar6].r - fVar35;
      Fout[lVar6] = kVar30;
      Fout = Fout + 1;
      lVar10 = lVar10 + fstride * 8;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    break;
  case 4:
    iVar11 = st->inverse;
    pkVar9 = st->twiddles;
    lVar7 = 0;
    lVar10 = 0;
    pkVar5 = pkVar9;
    do {
      uVar1 = *(undefined8 *)((long)&pkVar9->r + lVar10);
      fVar15 = (float)uVar1;
      fVar20 = (float)((ulong)uVar1 >> 0x20);
      fVar21 = Fout[lVar6 + lVar7].r * fVar20 + Fout[lVar6 + lVar7].i * fVar15;
      fVar25 = Fout[lVar6 + lVar7].r * fVar15 + -Fout[lVar6 + lVar7].i * fVar20;
      uVar1 = *(undefined8 *)((long)&pkVar9->r + lVar10 * 2);
      fVar20 = (float)uVar1;
      fVar40 = (float)((ulong)uVar1 >> 0x20);
      fVar15 = Fout[lVar6 * 2 + lVar7].r * fVar20 + fVar40 * -Fout[lVar6 * 2 + lVar7].i;
      fVar20 = Fout[lVar6 * 2 + lVar7].r * fVar40 + fVar20 * Fout[lVar6 * 2 + lVar7].i;
      fVar35 = (*pkVar5).r;
      fVar33 = (*pkVar5).i;
      fVar40 = Fout[lVar6 * 3 + lVar7].r * fVar33 + Fout[lVar6 * 3 + lVar7].i * fVar35;
      fVar35 = Fout[lVar6 * 3 + lVar7].r * fVar35 + -Fout[lVar6 * 3 + lVar7].i * fVar33;
      fVar36 = Fout[lVar7].r;
      fVar38 = Fout[lVar7].i;
      fVar33 = fVar36 - fVar15;
      fVar34 = fVar38 - fVar20;
      kVar16.r = fVar15 + fVar36;
      kVar16.i = fVar20 + fVar38;
      Fout[lVar7] = kVar16;
      fVar15 = fVar21 - fVar40;
      fVar20 = fVar25 - fVar35;
      fVar40 = fVar40 + fVar21;
      fVar35 = fVar35 + fVar25;
      kVar17.r = kVar16.r - fVar35;
      kVar17.i = kVar16.i - fVar40;
      Fout[lVar6 * 2 + lVar7] = kVar17;
      kVar18.r = Fout[lVar7].r + fVar35;
      kVar18.i = Fout[lVar7].i + fVar40;
      Fout[lVar7] = kVar18;
      if (iVar11 == 0) {
        fVar21 = fVar34 + fVar20;
        kVar24.i = fVar34 - fVar20;
        kVar24.r = fVar33 + fVar15;
        Fout[lVar6 + lVar7] = kVar24;
        Fout[lVar6 * 3 + lVar7].r = fVar33 - fVar15;
      }
      else {
        Fout[lVar6 + lVar7].r = fVar33 - fVar15;
        Fout[lVar6 + lVar7].i = fVar34 + fVar20;
        Fout[lVar6 * 3 + lVar7].r = fVar33 + fVar15;
        fVar21 = fVar34 - fVar20;
      }
      pkVar5 = pkVar5 + fstride * 3;
      Fout[lVar6 * 3 + lVar7].i = fVar21;
      lVar10 = lVar10 + fstride * 8;
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
    break;
  case 5:
    if (0 < iVar11) {
      lVar7 = lVar6 * fstride;
      fVar15 = st->twiddles[lVar7].r;
      fVar20 = st->twiddles[lVar7].i;
      fVar21 = st->twiddles[lVar7 * 2].r;
      fVar25 = st->twiddles[lVar7 * 2].i;
      lVar7 = 0;
      lVar10 = 0;
      lVar13 = 0;
      do {
        fVar40 = *(float *)((long)&Fout[lVar6].r + lVar7);
        fVar35 = *(float *)((long)&Fout[lVar6].i + lVar7);
        fVar33 = *(float *)((long)&Fout[(uint)(iVar11 * 2)].r + lVar7);
        fVar34 = *(float *)((long)&Fout[(uint)(iVar11 * 2)].i + lVar7);
        fVar36 = *(float *)((long)&Fout[(uint)(iVar11 * 3)].r + lVar7);
        fVar38 = *(float *)((long)&Fout[(uint)(iVar11 * 3)].i + lVar7);
        uVar1 = *(undefined8 *)((long)&st->twiddles[0].r + lVar13);
        fVar31 = (float)uVar1;
        fVar32 = (float)((ulong)uVar1 >> 0x20);
        fVar29 = fVar40 * fVar31 + fVar32 * -fVar35;
        fVar31 = fVar40 * fVar32 + fVar31 * fVar35;
        fVar40 = *(float *)((long)&Fout[(uint)(iVar11 * 4)].r + lVar7);
        uVar1 = *(undefined8 *)((long)&st->twiddles[0].r + lVar13 * 2);
        fVar37 = (float)uVar1;
        fVar39 = (float)((ulong)uVar1 >> 0x20);
        fVar35 = *(float *)((long)&Fout[(uint)(iVar11 * 4)].i + lVar7);
        fVar32 = fVar33 * fVar37 + fVar39 * -fVar34;
        fVar33 = fVar33 * fVar39 + fVar37 * fVar34;
        uVar1 = *(undefined8 *)((long)&st->twiddles[0].r + lVar10);
        fVar37 = (float)uVar1;
        fVar39 = (float)((ulong)uVar1 >> 0x20);
        uVar1 = *(undefined8 *)((long)&Fout->r + lVar7);
        fVar34 = fVar36 * fVar37 + fVar39 * -fVar38;
        fVar36 = fVar36 * fVar39 + fVar37 * fVar38;
        uVar2 = *(undefined8 *)(&st->twiddles[0].r + lVar13);
        fVar38 = (float)uVar2;
        fVar37 = (float)((ulong)uVar2 >> 0x20);
        fVar39 = fVar40 * fVar38 + fVar37 * -fVar35;
        fVar40 = fVar40 * fVar37 + fVar38 * fVar35;
        fVar41 = fVar29 + fVar39;
        fVar42 = fVar31 + fVar40;
        fVar29 = fVar29 - fVar39;
        fVar31 = fVar31 - fVar40;
        fVar40 = fVar32 + fVar34;
        fVar38 = fVar33 + fVar36;
        fVar33 = fVar33 - fVar36;
        fVar36 = (float)uVar1;
        fVar37 = (float)((ulong)uVar1 >> 0x20);
        *(ulong *)((long)&Fout->r + lVar7) =
             CONCAT44(fVar38 + fVar42 + fVar37,fVar40 + fVar41 + fVar36);
        fVar39 = fVar40 * fVar21 + fVar41 * fVar15 + fVar36;
        fVar43 = fVar38 * fVar21 + fVar42 * fVar15 + fVar37;
        fVar35 = -(fVar32 - fVar34);
        fVar34 = fVar31 * fVar20 + fVar25 * fVar33;
        fVar32 = -fVar29 * fVar20 + fVar25 * fVar35;
        *(ulong *)((long)&Fout[lVar6].r + lVar7) = CONCAT44(fVar43 - fVar32,fVar39 - fVar34);
        *(ulong *)((long)&Fout[(uint)(iVar11 * 4)].r + lVar7) =
             CONCAT44(fVar32 + fVar43,fVar34 + fVar39);
        fVar34 = fVar40 * fVar15 + fVar41 * fVar21 + fVar36;
        fVar36 = fVar38 * fVar15 + fVar42 * fVar21 + fVar37;
        fVar40 = -fVar31 * fVar25 + fVar33 * fVar20;
        fVar35 = fVar29 * fVar25 + fVar35 * fVar20;
        *(float *)((long)&Fout[(uint)(iVar11 * 2)].r + lVar7) = fVar40 + fVar34;
        *(float *)((long)&Fout[(uint)(iVar11 * 2)].i + lVar7) = fVar35 + fVar36;
        *(ulong *)((long)&Fout[(uint)(iVar11 * 3)].r + lVar7) =
             CONCAT44(fVar36 - fVar35,fVar34 - fVar40);
        lVar13 = lVar13 + fstride * 8;
        lVar10 = lVar10 + fstride * 0x18;
        lVar7 = lVar7 + 8;
      } while (lVar6 << 3 != lVar7);
    }
    break;
  default:
    iVar4 = st->nfft;
    pkVar5 = (kiss_fft_cpx *)malloc((long)(int)uVar3 * 8);
    if (0 < iVar11) {
      local_68 = 0;
      local_60 = Fout;
      do {
        if (0 < (int)uVar3) {
          uVar12 = 0;
          pkVar9 = local_60;
          do {
            pkVar5[uVar12] = *pkVar9;
            uVar12 = uVar12 + 1;
            pkVar9 = pkVar9 + lVar6;
          } while (uVar3 != uVar12);
          if (0 < (int)uVar3) {
            kVar16 = *pkVar5;
            uVar14 = 0;
            lVar7 = local_68;
            do {
              Fout[lVar7] = kVar16;
              if (1 < (int)uVar3) {
                local_58 = (int)fstride;
                kVar19 = Fout[lVar7];
                lVar10 = 0;
                iVar11 = 0;
                do {
                  iVar11 = iVar11 + (int)lVar7 * local_58;
                  iVar8 = iVar4;
                  if (iVar11 < iVar4) {
                    iVar8 = 0;
                  }
                  iVar11 = iVar11 - iVar8;
                  fVar20 = st->twiddles[iVar11].r;
                  fVar21 = st->twiddles[iVar11].i;
                  fVar15 = kVar19.i;
                  kVar19.r = kVar19.r +
                             pkVar5[lVar10 + 1].r * fVar20 + fVar21 * -pkVar5[lVar10 + 1].i;
                  kVar19.i = fVar15 + pkVar5[lVar10 + 1].r * fVar21 + fVar20 * pkVar5[lVar10 + 1].i;
                  Fout[lVar7] = kVar19;
                  lVar10 = lVar10 + 1;
                } while ((ulong)uVar3 - 1 != lVar10);
              }
              lVar7 = lVar7 + lVar6;
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar3);
          }
        }
        local_68 = local_68 + 1;
        local_60 = local_60 + 1;
      } while (local_68 != lVar6);
    }
    free(pkVar5);
    return;
  }
  return;
}

Assistant:

static
void kf_work(
        kiss_fft_cpx * Fout,
        const kiss_fft_cpx * f,
        const size_t fstride,
        int in_stride,
        int * factors,
        const kiss_fft_cfg st
        )
{
    kiss_fft_cpx * Fout_beg=Fout;
    const int p=*factors++; /* the radix  */
    const int m=*factors++; /* stage's fft length/p */
    const kiss_fft_cpx * Fout_end = Fout + p*m;

#ifdef _OPENMP
    // use openmp extensions at the 
    // top-level (not recursive)
//    if (fstride==1 && p<=5)
//  see http://sourceforge.net/p/kissfft/bugs/10/
    if (fstride==1 && p<=5 && m!=1)
    {
        int k;

        // execute the p different work units in different threads
#       pragma omp parallel for
        for (k=0;k<p;++k) 
            kf_work( Fout +k*m, f+ fstride*in_stride*k,fstride*p,in_stride,factors,st);
        // all threads have joined by this point

        switch (p) {
            case 2: kf_bfly2(Fout,fstride,st,m); break;
            case 3: kf_bfly3(Fout,fstride,st,m); break; 
            case 4: kf_bfly4(Fout,fstride,st,m); break;
            case 5: kf_bfly5(Fout,fstride,st,m); break; 
            default: kf_bfly_generic(Fout,fstride,st,m,p); break;
        }
        return;
    }
#endif

    if (m==1) {
        do{
            *Fout = *f;
            f += fstride*in_stride;
        }while(++Fout != Fout_end );
    }else{
        do{
            // recursive call:
            // DFT of size m*p performed by doing
            // p instances of smaller DFTs of size m, 
            // each one takes a decimated version of the input
            kf_work( Fout , f, fstride*p, in_stride, factors,st);
            f += fstride*in_stride;
        }while( (Fout += m) != Fout_end );
    }

    Fout=Fout_beg;

    // recombine the p smaller DFTs 
    switch (p) {
        case 2: kf_bfly2(Fout,fstride,st,m); break;
        case 3: kf_bfly3(Fout,fstride,st,m); break; 
        case 4: kf_bfly4(Fout,fstride,st,m); break;
        case 5: kf_bfly5(Fout,fstride,st,m); break; 
        default: kf_bfly_generic(Fout,fstride,st,m,p); break;
    }
}